

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageSizeCase::iterate(ImageSizeCase *this)

{
  pointer *pppSVar1;
  TextureType TVar2;
  RenderContext *renderCtx;
  TestLog *log;
  ImageSizeCase *pIVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar8;
  undefined8 *puVar9;
  long *plVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  RenderContext *renderContext;
  long *plVar11;
  TextureFormat *format;
  GLenum target;
  ulong uVar12;
  undefined8 uVar13;
  undefined1 isSampler;
  long lVar14;
  CallLogWrapper glLog;
  ulong *local_528;
  long local_520;
  ulong local_518 [2];
  long *local_508;
  undefined8 local_500;
  long local_4f8;
  undefined8 uStack_4f0;
  ImageSizeCase *local_4e8;
  string local_4e0;
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  Texture shaderOutResultTexture;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  string shaderImageTypeStr;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  Texture mainTexture;
  string glslVersionDeclaration;
  string shaderImageFormatStr;
  Buffer mainTextureBuf;
  TextureFormat local_2a8;
  value_type local_2a0;
  ShaderProgram program;
  UniformAccessLogger uniforms;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar5),log);
  dVar6 = glu::getInternalFormat(this->m_format);
  target = 0xffffffff;
  if ((ulong)this->m_imageType < 8) {
    target = *(GLenum *)(&DAT_01c9d058 + (ulong)this->m_imageType * 4);
  }
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&mainTextureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar5),pOVar7
            );
  iVar5 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&mainTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar7);
  iVar5 = (*renderCtx->_vptr_RenderContext[3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&shaderOutResultTexture.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar5),pOVar7);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  }
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,") for storing the shader output",0x1f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,target,mainTexture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  setTextureStorage(&glLog,this->m_imageType,dVar6,&this->m_imageSize,
                    mainTextureBuf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,mainTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar6);
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar6 = (**(code **)(CONCAT44(extraout_var_03,iVar5) + 0x800))();
  glu::checkError(dVar6,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaed);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
  glu::CallLogWrapper::glBindTexture
            (&glLog,0xde1,shaderOutResultTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(&glLog,0xde1,1,0x8236,1,1);
  isSampler = 1;
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,1,shaderOutResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,0x8236);
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar6 = (**(code **)(CONCAT44(extraout_var_04,iVar5) + 0x800))();
  glu::checkError(dVar6,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xaf4);
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)&this->m_format,format);
  renderContext = (RenderContext *)0x0;
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,this->m_imageType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar8 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar8,(allocator<char> *)&program);
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(&uniforms,0,0xac);
  local_528 = local_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_528);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_4e0,(Functional *)(ulong)this->m_imageType,(TextureType)renderCtx,renderContext)
  ;
  uVar12 = 0xf;
  if (local_528 != local_518) {
    uVar12 = local_518[0];
  }
  if (uVar12 < local_4e0._M_string_length + local_520) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      uVar13 = local_4e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_4e0._M_string_length + local_520) goto LAB_014ba195;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_528);
  }
  else {
LAB_014ba195:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_4e0._M_dataplus._M_p);
  }
  local_508 = &local_4f8;
  plVar10 = puVar9 + 2;
  if ((long *)*puVar9 == plVar10) {
    local_4f8 = *plVar10;
    uStack_4f0 = puVar9[3];
  }
  else {
    local_4f8 = *plVar10;
    local_508 = (long *)*puVar9;
  }
  local_500 = puVar9[1];
  *puVar9 = plVar10;
  puVar9[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_508);
  local_4c0 = &local_4b0;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_4b0 = *plVar11;
    lStack_4a8 = plVar10[3];
  }
  else {
    local_4b0 = *plVar11;
    local_4c0 = (long *)*plVar10;
  }
  local_4b8 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4c0,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_4a0 = &local_490;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_490 = *plVar11;
    lStack_488 = plVar10[3];
  }
  else {
    local_490 = *plVar11;
    local_4a0 = (long *)*plVar10;
  }
  local_498 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_480 = &local_470;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_470 = *plVar11;
    lStack_468 = plVar10[3];
  }
  else {
    local_470 = *plVar11;
    local_480 = (long *)*plVar10;
  }
  local_478 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_480,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_460 = &local_450;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_450 = *plVar11;
    lStack_448 = plVar10[3];
  }
  else {
    local_450 = *plVar11;
    local_460 = (long *)*plVar10;
  }
  local_458 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_440 = &local_430;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_430 = *plVar11;
    lStack_428 = plVar10[3];
  }
  else {
    local_430 = *plVar11;
    local_440 = (long *)*plVar10;
  }
  local_438 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_420 = &local_410;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_410 = *plVar11;
    lStack_408 = plVar10[3];
  }
  else {
    local_410 = *plVar11;
    local_420 = (long *)*plVar10;
  }
  local_418 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_400 = &local_3f0;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_3f0 = *plVar11;
    lStack_3e8 = plVar10[3];
  }
  else {
    local_3f0 = *plVar11;
    local_400 = (long *)*plVar10;
  }
  local_3f8 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_400,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_3e0 = &local_3d0;
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_3d0 = *plVar11;
    lStack_3c8 = plVar10[3];
  }
  else {
    local_3d0 = *plVar11;
    local_3e0 = (long *)*plVar10;
  }
  local_3d8 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4e8 = this;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_378 = *plVar11;
    lStack_370 = plVar10[3];
    local_388 = &local_378;
  }
  else {
    local_378 = *plVar11;
    local_388 = (long *)*plVar10;
  }
  local_380 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_388);
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_328 = *plVar11;
    lStack_320 = plVar10[3];
    local_338 = &local_328;
  }
  else {
    local_328 = *plVar11;
    local_338 = (long *)*plVar10;
  }
  local_330 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_338);
  plVar11 = plVar10 + 2;
  if ((long *)*plVar10 == plVar11) {
    local_3b0 = *plVar11;
    uStack_3a8 = (undefined4)plVar10[3];
    uStack_3a4 = *(undefined4 *)((long)plVar10 + 0x1c);
    local_3c0 = &local_3b0;
  }
  else {
    local_3b0 = *plVar11;
    local_3c0 = (long *)*plVar10;
  }
  local_3b8 = plVar10[1];
  *plVar10 = (long)plVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_2a8.order = RG;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_3c0,local_3b8 + (long)local_3c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&uniforms.m_gl + ((ulong)local_2a8 & 0xffffffff) * 3),&local_2a0);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&uniforms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378 + 1);
  }
  pIVar3 = local_4e8;
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480,local_470 + 1);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0,local_490 + 1);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0,local_4b0 + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != local_518) {
    operator_delete(local_528,local_518[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&uniforms.m_gl + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  uniforms.m_gl = (Functions *)CONCAT44(extraout_var_05,iVar5);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_programGL = program.m_program.m_program;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_log = log;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((pIVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    glu::CallLogWrapper::glDispatchCompute(&glLog,1,1,1);
    iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
    dVar6 = (**(code **)(CONCAT44(extraout_var_06,iVar5) + 0x800))();
    glu::checkError(dVar6,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xb2a);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if (program.m_program.m_info.linkOk == false) goto LAB_014bab51;
  TVar2 = pIVar3->m_imageType;
  if (TVar2 < TEXTURETYPE_2D_ARRAY) {
    iVar5 = (pIVar3->m_imageSize).m_data[1] * 1000;
LAB_014baab7:
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = iVar5 + (pIVar3->m_imageSize).m_data[0];
  }
  else {
    if (TVar2 - TEXTURETYPE_2D_ARRAY < 2) {
      iVar5 = (pIVar3->m_imageSize).m_data[1] * 1000 + (pIVar3->m_imageSize).m_data[2] * 1000000;
      goto LAB_014baab7;
    }
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = -1;
    if (TVar2 == TEXTURETYPE_BUFFER) {
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = (this->m_imageSize).m_data[0];
    }
  }
  local_2a8.order = R;
  local_2a8.type = UNSIGNED_INT32;
  uniforms.m_gl = (Functions *)&DAT_100000001;
  uniforms.m_log = (TestLog *)CONCAT44(uniforms.m_log._4_4_,1);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_operator___021a9c40;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ =
       (int)program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = readIntegerTextureViaFBOAndVerify
                    (renderCtx,&glLog,shaderOutResultTexture.super_ObjectWrapper.m_object,
                     TEXTURETYPE_2D,&local_2a8,(IVec3 *)&uniforms,(ImageLayerVerifier *)&program);
  pcVar8 = "Got wrong value";
  if (bVar4) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pIVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,pcVar8);
LAB_014bab51:
  glu::ObjectWrapper::~ObjectWrapper(&shaderOutResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&mainTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&mainTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageSizeCase::IterateResult ImageSizeCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const glu::Buffer			mainTextureBuf			(renderCtx);
	const glu::Texture			mainTexture				(renderCtx);
	const glu::Texture			shaderOutResultTexture	(renderCtx);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *mainTexture << ")" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *mainTextureBuf << ")" << TestLog::EndMessage;
	log << TestLog::Message << "// Created a texture (name " << *shaderOutResultTexture << ") for storing the shader output" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *mainTexture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_imageType, internalFormatGL, m_imageSize, *mainTextureBuf);
	glLog.glBindImageTexture(0, *mainTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(GL_TEXTURE_2D, *shaderOutResultTexture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	setTextureStorage(glLog, TEXTURETYPE_2D, GL_R32UI, IVec3(1, 1, 1), 0 /* always 2d texture, no buffer needed */);
	glLog.glBindImageTexture(1, *shaderOutResultTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Read texture size in compute shader.

	{
		// Generate compute shader.

		const char* const	shaderImageAccessStr	= m_imageAccess == IMAGEACCESS_READ_ONLY			? "readonly"
													: m_imageAccess == IMAGEACCESS_WRITE_ONLY			? "writeonly"
													: m_imageAccess == IMAGEACCESS_READ_ONLY_WRITE_ONLY	? "readonly writeonly"
													: DE_NULL;
		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"precision highp uimage2D;\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + shaderImageAccessStr + " uniform " + shaderImageTypeStr + " u_image;\n"
														"layout (r32ui, binding=1) writeonly uniform uimage2D u_result;\n"
														"void main (void)\n"
														"{\n"
														+ (m_imageType == TEXTURETYPE_BUFFER ?
															"	int result = imageSize(u_image);\n"
														 : m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE ?
															"	ivec2 size = imageSize(u_image);\n"
															"	int result = size.y*1000 + size.x;\n"
														 : m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 size = imageSize(u_image);\n"
															"	int result = size.z*1000000 + size.y*1000 + size.x;\n"
														 : DE_NULL) +
														"	imageStore(u_result, ivec2(0, 0), uvec4(result));\n"
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and compare to reference.

	{
		const deUint32	referenceOutput		= m_imageType == TEXTURETYPE_BUFFER										? (deUint32)(												  m_imageSize.x())
											: m_imageType == TEXTURETYPE_2D || m_imageType == TEXTURETYPE_CUBE		? (deUint32)(						   m_imageSize.y()*1000 + m_imageSize.x())
											: m_imageType == TEXTURETYPE_3D || m_imageType == TEXTURETYPE_2D_ARRAY	? (deUint32)(m_imageSize.z()*1000000 + m_imageSize.y()*1000 + m_imageSize.x())
											: (deUint32)-1;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *shaderOutResultTexture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(referenceOutput)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}